

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O2

void __thiscall cmQtAutoGeneratorMocUic::SettingsFileRead(cmQtAutoGeneratorMocUic *this)

{
  FileSystem *this_00;
  bool bVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  string str;
  string local_80;
  string sep;
  cmCryptoHash crypt;
  
  cmCryptoHash::cmCryptoHash(&crypt,AlgoSHA256);
  std::__cxx11::string::string<std::allocator<char>>((string *)&sep," ~~~ ",(allocator<char> *)&str)
  ;
  if ((this->Moc_).Enabled == true) {
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    str._M_dataplus._M_p = (pointer)&str.field_2;
    std::__cxx11::string::append((string *)&str);
    std::__cxx11::string::append((string *)&str);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_80,&(this->Moc_).AllOptions,";");
    std::__cxx11::string::append((string *)&str);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::append((string *)&str);
    std::__cxx11::string::append((char *)&str);
    std::__cxx11::string::append((string *)&str);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_80,&(this->Moc_).PredefsCmd,";");
    std::__cxx11::string::append((string *)&str);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::append((string *)&str);
    cmCryptoHash::HashString(&local_80,&crypt,&str);
    std::__cxx11::string::operator=((string *)&this->SettingsStringMoc_,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&str);
  }
  if ((this->Uic_).Enabled == true) {
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    str._M_dataplus._M_p = (pointer)&str.field_2;
    std::__cxx11::string::append((string *)&str);
    std::__cxx11::string::append((string *)&str);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_80,&(this->Uic_).TargetOptions,";");
    std::__cxx11::string::append((string *)&str);
    std::__cxx11::string::~string((string *)&local_80);
    for (p_Var3 = (this->Uic_).Options._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->Uic_).Options._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::__cxx11::string::append((string *)&str);
      std::__cxx11::string::append((string *)&str);
      std::__cxx11::string::append((string *)&str);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_80,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(p_Var3 + 2),";");
      std::__cxx11::string::append((string *)&str);
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::append((string *)&str);
    cmCryptoHash::HashString(&local_80,&crypt,&str);
    std::__cxx11::string::operator=((string *)&this->SettingsStringUic_,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&str);
  }
  std::__cxx11::string::~string((string *)&sep);
  cmCryptoHash::~cmCryptoHash(&crypt);
  sep._M_dataplus._M_p = (pointer)&sep.field_2;
  sep._M_string_length = 0;
  sep.field_2._M_local_buf[0] = '\0';
  this_00 = &(this->super_cmQtAutoGenerator).FileSys_;
  bVar1 = cmQtAutoGenerator::FileSystem::FileRead(this_00,&sep,&this->SettingsFile_,(string *)0x0);
  bVar2 = (this->Moc_).Enabled;
  if (bVar1) {
    if (bVar2 != false) {
      cmQtAutoGenerator::SettingsFind(&str,&sep,"moc");
      bVar2 = std::operator!=(&this->SettingsStringMoc_,&str);
      std::__cxx11::string::~string((string *)&str);
      if (bVar2) {
        (this->Moc_).SettingsChanged = true;
      }
    }
    if ((this->Uic_).Enabled == true) {
      cmQtAutoGenerator::SettingsFind(&str,&sep,"uic");
      bVar2 = std::operator!=(&this->SettingsStringUic_,&str);
      std::__cxx11::string::~string((string *)&str);
      if (bVar2) {
        (this->Uic_).SettingsChanged = true;
      }
    }
    if (((this->Moc_).SettingsChanged != false) || ((this->Uic_).SettingsChanged == true)) {
      cmQtAutoGenerator::FileSystem::FileRemove(this_00,&this->SettingsFile_);
    }
  }
  else {
    if (bVar2 != false) {
      (this->Moc_).SettingsChanged = true;
    }
    if ((this->Uic_).Enabled == true) {
      (this->Uic_).SettingsChanged = true;
    }
  }
  std::__cxx11::string::~string((string *)&sep);
  return;
}

Assistant:

void cmQtAutoGeneratorMocUic::SettingsFileRead()
{
  // Compose current settings strings
  {
    cmCryptoHash crypt(cmCryptoHash::AlgoSHA256);
    std::string const sep(" ~~~ ");
    if (Moc_.Enabled) {
      std::string str;
      str += Moc().Executable;
      str += sep;
      str += cmJoin(Moc().AllOptions, ";");
      str += sep;
      str += Base().IncludeProjectDirsBefore ? "TRUE" : "FALSE";
      str += sep;
      str += cmJoin(Moc().PredefsCmd, ";");
      str += sep;
      SettingsStringMoc_ = crypt.HashString(str);
    }
    if (Uic().Enabled) {
      std::string str;
      str += Uic().Executable;
      str += sep;
      str += cmJoin(Uic().TargetOptions, ";");
      for (const auto& item : Uic().Options) {
        str += sep;
        str += item.first;
        str += sep;
        str += cmJoin(item.second, ";");
      }
      str += sep;
      SettingsStringUic_ = crypt.HashString(str);
    }
  }

  // Read old settings and compare
  {
    std::string content;
    if (FileSys().FileRead(content, SettingsFile_)) {
      if (Moc().Enabled) {
        if (SettingsStringMoc_ != SettingsFind(content, "moc")) {
          Moc_.SettingsChanged = true;
        }
      }
      if (Uic().Enabled) {
        if (SettingsStringUic_ != SettingsFind(content, "uic")) {
          Uic_.SettingsChanged = true;
        }
      }
      // In case any setting changed remove the old settings file.
      // This triggers a full rebuild on the next run if the current
      // build is aborted before writing the current settings in the end.
      if (Moc().SettingsChanged || Uic().SettingsChanged) {
        FileSys().FileRemove(SettingsFile_);
      }
    } else {
      // Settings file read failed
      if (Moc().Enabled) {
        Moc_.SettingsChanged = true;
      }
      if (Uic().Enabled) {
        Uic_.SettingsChanged = true;
      }
    }
  }
}